

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

SmallVector<wasm::Literal,_1UL> * __thiscall
wasm::SmallVector<wasm::Literal,_1UL>::operator=
          (SmallVector<wasm::Literal,_1UL> *this,SmallVector<wasm::Literal,_1UL> *other)

{
  this->usedFixed = other->usedFixed;
  wasm::Literal::operator=((this->fixed)._M_elems,(other->fixed)._M_elems);
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::_M_move_assign
            (&this->flexible,&other->flexible);
  return this;
}

Assistant:

SmallVector<T, N>& operator=(SmallVector<T, N>&& other) {
    usedFixed = other.usedFixed;
    fixed = std::move(other.fixed);
    flexible = std::move(other.flexible);
    return *this;
  }